

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

Atom * __thiscall Potassco::SmodelsConvert::SmData::mapAtom(SmData *this,Atom_t a)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  uint in_ESI;
  SmData *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  SmData *this_00;
  reference local_8;
  
  this_00 = in_RDI;
  bVar2 = mapped(in_RDI,(Atom_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (bVar2) {
    local_8 = std::
              vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
              ::operator[](&in_RDI->atoms_,(ulong)in_ESI);
  }
  else {
    uVar3 = (ulong)in_ESI;
    sVar4 = std::
            vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
            ::size(&in_RDI->atoms_);
    if (sVar4 <= uVar3) {
      std::
      vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
      ::resize(&this_00->atoms_,CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    }
    uVar1 = in_RDI->next_;
    in_RDI->next_ = uVar1 + 1;
    pvVar5 = std::
             vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
             ::operator[](&in_RDI->atoms_,(ulong)in_ESI);
    *pvVar5 = (value_type)((uint)*pvVar5 & 0xf0000000 | uVar1 & 0xfffffff);
    local_8 = std::
              vector<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
              ::operator[](&in_RDI->atoms_,(ulong)in_ESI);
  }
  return local_8;
}

Assistant:

Atom&  mapAtom(Atom_t a) {
		if (mapped(a)) { return atoms_[a]; }
		if (a >= atoms_.size()) { atoms_.resize(a + 1); }
		atoms_[a].smId = next_++;
		return atoms_[a];
	}